

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

int __thiscall cppurses::System::run(System *this)

{
  Widget *args;
  int iVar1;
  Event local_38;
  
  if (head_ == (Widget *)0x0) {
    iVar1 = -1;
  }
  else {
    if (initial_focus_ != (Widget *)0x0) {
      (*initial_focus_->_vptr_Widget[2])(initial_focus_,1,0);
      Focus::set_focus_to(initial_focus_);
      local_38.type_ = FocusIn;
      local_38.receiver_ = initial_focus_;
      local_38._vptr_Event = (_func_int **)&PTR__Event_0017c1b8;
      send_event(&local_38);
    }
    Terminal::initialize((Terminal *)terminal);
    args = head_;
    local_38._vptr_Event = (_func_int **)Terminal::width((Terminal *)terminal);
    local_38._8_8_ = Terminal::height((Terminal *)terminal);
    post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>(args,(Area *)&local_38);
    iVar1 = Event_loop::run((Event_loop *)user_input_loop_);
    Terminal::uninitialize((Terminal *)terminal);
  }
  return iVar1;
}

Assistant:

int System::run()
{
    if (System::head() == nullptr)
        return -1;
    if (initial_focus_ != nullptr) {
        initial_focus_->enable(true, false);
        Focus::set_focus_to(*initial_focus_);
        System::send_event(Focus_in_event{*initial_focus_});
    }
    terminal.initialize();
    System::post_event<Resize_event>(*System::head(),
                                     Area{terminal.width(), terminal.height()});
    const auto exit_code = user_input_loop_.run();
    terminal.uninitialize();
    return exit_code;
}